

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::End(void)

{
  ImGuiLastItemData *pIVar1;
  float *pfVar2;
  ImRect *pIVar3;
  int iVar4;
  uint uVar5;
  ImGuiWindowStackData *pIVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ImVec2 IVar11;
  ImGuiID IVar12;
  ImGuiItemFlags IVar13;
  ImGuiContext *pIVar14;
  ImGuiItemStatusFlags IVar15;
  float fVar16;
  ImGuiWindow *pIVar17;
  
  pIVar14 = GImGui;
  pIVar17 = GImGui->CurrentWindow;
  if (((GImGui->CurrentWindowStack).Size < 2) &&
     (GImGui->WithinFrameScopeWithImplicitWindow != false)) {
    return;
  }
  if ((pIVar17->DC).CurrentColumns != (ImGuiOldColumns *)0x0) {
    EndColumns();
  }
  PopClipRect();
  if ((pIVar17->Flags & 0x1000000) == 0) {
    LogFinish();
  }
  pIVar6 = (pIVar14->CurrentWindowStack).Data;
  iVar4 = (pIVar14->CurrentWindowStack).Size;
  pIVar1 = &pIVar6[(long)iVar4 + -1].ParentLastItemDataBackup;
  IVar12 = pIVar1->ID;
  IVar13 = pIVar1->InFlags;
  IVar15 = pIVar1->StatusFlags;
  fVar16 = (pIVar1->Rect).Min.x;
  pfVar2 = &pIVar6[(long)iVar4 + -1].ParentLastItemDataBackup.Rect.Min.y;
  uVar7 = *(undefined8 *)pfVar2;
  uVar8 = *(undefined8 *)(pfVar2 + 2);
  pfVar2 = &pIVar6[(long)iVar4 + -1].ParentLastItemDataBackup.NavRect.Min.y;
  uVar9 = *(undefined8 *)pfVar2;
  uVar10 = *(undefined8 *)(pfVar2 + 2);
  pIVar3 = &pIVar6[(long)iVar4 + -1].ParentLastItemDataBackup.DisplayRect;
  IVar11 = pIVar3->Max;
  (pIVar14->LastItemData).DisplayRect.Min = pIVar3->Min;
  (pIVar14->LastItemData).DisplayRect.Max = IVar11;
  *(undefined8 *)&(pIVar14->LastItemData).NavRect.Min.y = uVar9;
  *(undefined8 *)&(pIVar14->LastItemData).NavRect.Max.y = uVar10;
  *(undefined8 *)&(pIVar14->LastItemData).Rect.Min.y = uVar7;
  *(undefined8 *)&(pIVar14->LastItemData).Rect.Max.y = uVar8;
  (pIVar14->LastItemData).ID = IVar12;
  (pIVar14->LastItemData).InFlags = IVar13;
  (pIVar14->LastItemData).StatusFlags = IVar15;
  (pIVar14->LastItemData).Rect.Min.x = fVar16;
  uVar5 = pIVar17->Flags;
  if ((uVar5 >> 0x1c & 1) != 0) {
    pIVar14->BeginMenuCount = pIVar14->BeginMenuCount + -1;
  }
  if ((uVar5 >> 0x1a & 1) != 0) {
    (pIVar14->BeginPopupStack).Size = (pIVar14->BeginPopupStack).Size + -1;
  }
  (pIVar14->CurrentWindowStack).Size = iVar4 + -1;
  if (iVar4 + -1 == 0) {
    pIVar17 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar17 = pIVar6[(long)iVar4 + -2].Window;
  }
  SetCurrentWindow(pIVar17);
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop from window stack
    g.LastItemData = g.CurrentWindowStack.back().ParentLastItemDataBackup;
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
        g.BeginMenuCount--;
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    g.CurrentWindowStack.back().StackSizesOnBegin.CompareWithCurrentState();
    g.CurrentWindowStack.pop_back();
    SetCurrentWindow(g.CurrentWindowStack.Size == 0 ? NULL : g.CurrentWindowStack.back().Window);
}